

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

GLchar * __thiscall
gl4cts::GLSL420Pack::BindingImageInvalidTest::getCaseString
          (BindingImageInvalidTest *this,TESTCASES test_case)

{
  TestError *this_00;
  undefined4 in_register_00000034;
  
  if ((ulong)this->m_case < 5) {
    return *(GLchar **)(&DAT_020dcee0 + (ulong)this->m_case * 8);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38,CONCAT44(in_register_00000034,test_case));
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x3411);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const GLchar* BindingImageInvalidTest::getCaseString(TESTCASES test_case)
{
	(void)test_case;
	const GLchar* binding = 0;

	switch (m_case)
	{
	case NEGATIVE_VALUE:
		binding = "= -1";
		break;
	case VARIABLE_NAME:
		binding = "= goku";
		break;
	case STD140:
		binding = "= std140";
		break;
	case MISSING:
		binding = "";
		break;
	case TEST_CASES_MAX:
		binding = "= 0";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return binding;
}